

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

int __thiscall sing::HttpServer::setNonblocking(HttpServer *this,int fd)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  
  uVar1 = fcntl(fd,3,0);
  if ((uVar1 != 0xffffffff) && (iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800)), iVar2 != -1)) {
    return 0;
  }
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  printf("[Utils::setNonBlocking]fd = %d fcntl : %s\n",fd,pcVar4);
  return -1;
}

Assistant:

int HttpServer::setNonblocking(int fd){
    // 获取套接字选项
    int flag = fcntl(fd, F_GETFL, 0);
    if(flag == -1) {
        printf("[Utils::setNonBlocking]fd = %d fcntl : %s\n", fd, strerror(errno));
        return -1;
    }
    // 设置非阻塞
    flag |= O_NONBLOCK;
    if(fcntl(fd, F_SETFL, flag) == -1) {
        printf("[Utils::setNonBlocking]fd = %d fcntl : %s\n", fd, strerror(errno));
        return -1;
    }
    return 0;
}